

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

void __thiscall efsw::FileInfo::FileInfo(FileInfo *this,string *filepath,bool linkInfo)

{
  pointer pcVar1;
  undefined7 in_register_00000011;
  
  (this->Filepath)._M_dataplus._M_p = (pointer)&(this->Filepath).field_2;
  pcVar1 = (filepath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + filepath->_M_string_length);
  this->ModificationTime = 0;
  this->OwnerId = 0;
  this->GroupId = 0;
  this->Permissions = 0;
  this->Inode = 0;
  if ((int)CONCAT71(in_register_00000011,linkInfo) == 0) {
    getInfo(this);
  }
  else {
    getRealInfo(this);
  }
  return;
}

Assistant:

FileInfo::FileInfo( const std::string& filepath, bool linkInfo ) :
	Filepath( filepath ),
	ModificationTime(0),
	OwnerId(0),
	GroupId(0),
	Permissions(0),
	Inode(0)
{
	if ( linkInfo )
	{
		getRealInfo();
	}
	else
	{
		getInfo();
	}
}